

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latch_test.cpp
# Opt level: O1

void __thiscall LatchTest_Wait_Test::~LatchTest_Wait_Test(LatchTest_Wait_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(LatchTest, Wait)
{
  SETUP_STEPTEST;
  yamc::latch latch{1};
  // signal-thread
  yamc::test::join_thread thd([&]{
    EXPECT_STEP(1);
    EXPECT_NO_THROW(latch.count_down(0));  // no signal
    EXPECT_STEP(2);
    EXPECT_NO_THROW(latch.count_down());
  });
  // wait-thread
  {
    EXPECT_NO_THROW(latch.wait());
    EXPECT_STEP(3);
  }
}